

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void solver_updated_cb(int remaining_constraints,double value,long loop,double duration,
                      long reinit_number)

{
  unsigned_long_long uVar1;
  size_t sVar2;
  char *pcVar3;
  string_view format_str;
  format_args args;
  double local_48 [2];
  long local_38;
  double local_28;
  long local_18;
  
  local_38 = loop;
  if (remaining_constraints < 1) {
    if (loop < 0) {
      local_38 = -loop;
      pcVar3 = "  - Solution found via push: {:f} (loop: {} t: {}s reinit: {})\n";
      sVar2 = 0x3f;
    }
    else {
      pcVar3 = "  - Solution found: {:f} (loop: {} t: {}s reinit: {})\n";
      sVar2 = 0x36;
    }
    uVar1 = 0x3a3a;
    local_48[0] = value;
  }
  else {
    local_48[0] = (double)(ulong)(uint)remaining_constraints;
    pcVar3 = "  - Constraints remaining: {} (loop: {} t: {}s reinit: {})\n";
    sVar2 = 0x3b;
    uVar1 = 0x3a31;
  }
  format_str.size_ = sVar2;
  format_str.data_ = pcVar3;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       local_48;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = uVar1;
  local_28 = duration;
  local_18 = reinit_number;
  fmt::v7::vprint(_stdout,format_str,args);
  return;
}

Assistant:

static void
solver_updated_cb(int remaining_constraints,
                  double value,
                  long int loop,
                  double duration,
                  long int reinit_number)
{
    if (remaining_constraints > 0) {
        fmt::print(
          "  - Constraints remaining: {} (loop: {} t: {}s reinit: {})\n",
          remaining_constraints,
          loop,
          duration,
          reinit_number);
    } else {
        if (loop >= 0)
            fmt::print(
              "  - Solution found: {:f} (loop: {} t: {}s reinit: {})\n",
              value,
              loop,
              duration,
              reinit_number);
        else
            fmt::print("  - Solution found via push: {:f} (loop: {} t: {}s "
                       "reinit: {})\n",
                       value,
                       -loop,
                       duration,
                       reinit_number);
    }
}